

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O3

QRect __thiscall
QPixmapStyle::subElementRect
          (QPixmapStyle *this,SubElement element,QStyleOption *option,QWidget *widget)

{
  long lVar1;
  long in_FS_OFFSET;
  QRect QVar2;
  ControlDescriptor local_7c;
  QPixmapStyleDescriptor local_78;
  QRect local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (element == SE_LineEditContents) {
    lVar1 = *(long *)&(this->super_QCommonStyle).super_QStyle.field_0x8;
    QVar2 = QCommonStyle::subElementRect
                      (&this->super_QCommonStyle,SE_LineEditContents,option,widget);
    local_7c = LE_Enabled;
    QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>::value
              (&local_78,
               (QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor> *)(lVar1 + 0xe8),
               &local_7c);
    local_40.y1.m_i = QVar2.y1.m_i.m_i + local_78.margins.m_top.m_i;
    local_40.x1.m_i = local_78.margins.m_left.m_i + QVar2.x1.m_i.m_i;
    local_40.x2.m_i = QVar2.x2.m_i.m_i - local_78.margins.m_right.m_i;
    local_40.y2.m_i = QVar2.y2.m_i.m_i - local_78.margins.m_bottom.m_i;
    local_40 = QStyle::visualRect(option->direction,&option->rect,&local_40);
    QVar2 = local_40;
    if (&(local_78.fileName.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.fileName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.fileName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_78.fileName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_78.fileName.d.d)->super_QArrayData,2,0x10);
        QVar2 = local_40;
      }
    }
  }
  else {
    QVar2 = QCommonStyle::subElementRect(&this->super_QCommonStyle,element,option,widget);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return QVar2;
}

Assistant:

QRect QPixmapStyle::subElementRect(SubElement element, const QStyleOption *option,
                                   const QWidget *widget) const
{
    Q_D(const QPixmapStyle);

    switch (element) {
    case SE_LineEditContents:
    {
        QRect rect = QCommonStyle::subElementRect(element, option, widget);
        const QPixmapStyleDescriptor &desc = d->descriptors.value(LE_Enabled);
        rect.adjust(desc.margins.left(), desc.margins.top(),
                    -desc.margins.right(), -desc.margins.bottom());
        rect = visualRect(option->direction, option->rect, rect);
        return rect;
    }
    default: ;
    }

    return QCommonStyle::subElementRect(element, option, widget);
}